

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.h
# Opt level: O0

void __thiscall basisu::basisu_backend_output::clear(basisu_backend_output *this)

{
  vector<basisu::basisu_backend_slice_desc> *in_RDI;
  
  *(undefined4 *)&in_RDI->m_p = 0;
  *(undefined1 *)((long)&in_RDI->m_p + 4) = 0;
  *(undefined1 *)((long)&in_RDI->m_p + 5) = 0;
  *(undefined1 *)((long)&in_RDI->m_p + 6) = 1;
  in_RDI->m_size = 0;
  in_RDI->m_capacity = 0;
  vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  vector<basisu::basisu_backend_slice_desc>::clear(in_RDI);
  vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  vector<basisu::vector<unsigned_char>_>::clear((vector<basisu::vector<unsigned_char>_> *)in_RDI);
  vector<unsigned_short>::clear((vector<unsigned_short> *)in_RDI);
  return;
}

Assistant:

void clear()
		{
			m_tex_format = basist::basis_tex_format::cETC1S;
			m_etc1s = false;
			m_uses_global_codebooks = false;
			m_srgb = true;

			m_num_endpoints = 0;
			m_num_selectors = 0;

			m_endpoint_palette.clear();
			m_selector_palette.clear();
			m_slice_desc.clear();
			m_slice_image_tables.clear();
			m_slice_image_data.clear();
			m_slice_image_crcs.clear();
		}